

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

size_t httplib::detail::to_utf8(int code,char *buff)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *buff_local;
  size_t sStack_10;
  int code_local;
  
  bVar1 = (byte)code;
  if (code < 0x80) {
    *buff = bVar1 & 0x7f;
    sStack_10 = 1;
  }
  else {
    bVar2 = (byte)(code >> 6);
    if (code < 0x800) {
      *buff = bVar2 & 0x1f | 0xc0;
      buff[1] = bVar1 & 0x3f | 0x80;
      sStack_10 = 2;
    }
    else {
      bVar3 = (byte)(code >> 0xc);
      if (code < 0xd800) {
        *buff = bVar3 & 0xf | 0xe0;
        buff[1] = bVar2 & 0x3f | 0x80;
        buff[2] = bVar1 & 0x3f | 0x80;
        sStack_10 = 3;
      }
      else if (code < 0xe000) {
        sStack_10 = 0;
      }
      else if (code < 0x10000) {
        *buff = bVar3 & 0xf | 0xe0;
        buff[1] = bVar2 & 0x3f | 0x80;
        buff[2] = bVar1 & 0x3f | 0x80;
        sStack_10 = 3;
      }
      else if (code < 0x110000) {
        *buff = (byte)(code >> 0x12) & 7 | 0xf0;
        buff[1] = bVar3 & 0x3f | 0x80;
        buff[2] = bVar2 & 0x3f | 0x80;
        buff[3] = bVar1 & 0x3f | 0x80;
        sStack_10 = 4;
      }
      else {
        sStack_10 = 0;
      }
    }
  }
  return sStack_10;
}

Assistant:

inline size_t to_utf8(int code, char *buff) {
			if (code < 0x0080) {
				buff[0] = (code & 0x7F);
				return 1;
			} else if (code < 0x0800) {
				buff[0] = static_cast<char>(0xC0 | ((code >> 6) & 0x1F));
				buff[1] = static_cast<char>(0x80 | (code & 0x3F));
				return 2;
			} else if (code < 0xD800) {
				buff[0] = static_cast<char>(0xE0 | ((code >> 12) & 0xF));
				buff[1] = static_cast<char>(0x80 | ((code >> 6) & 0x3F));
				buff[2] = static_cast<char>(0x80 | (code & 0x3F));
				return 3;
			} else if (code < 0xE000) { // D800 - DFFF is invalid...
				return 0;
			} else if (code < 0x10000) {
				buff[0] = static_cast<char>(0xE0 | ((code >> 12) & 0xF));
				buff[1] = static_cast<char>(0x80 | ((code >> 6) & 0x3F));
				buff[2] = static_cast<char>(0x80 | (code & 0x3F));
				return 3;
			} else if (code < 0x110000) {
				buff[0] = static_cast<char>(0xF0 | ((code >> 18) & 0x7));
				buff[1] = static_cast<char>(0x80 | ((code >> 12) & 0x3F));
				buff[2] = static_cast<char>(0x80 | ((code >> 6) & 0x3F));
				buff[3] = static_cast<char>(0x80 | (code & 0x3F));
				return 4;
			}

			// NOTREACHED
			return 0;
		}